

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

void __thiscall
VPLGrammar::Parser::MainRuleNode::BuildProgram(MainRuleNode *this,Scope *scope,ostream *out)

{
  size_type sVar1;
  const_reference this_00;
  pointer pAVar2;
  ulong local_28;
  size_t i;
  ostream *out_local;
  Scope *scope_local;
  MainRuleNode *this_local;
  
  local_28 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
            ::size(&(this->super_ASTNodeBasic).children_);
    if (sVar1 <= local_28) break;
    this_00 = std::
              vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
              ::operator[](&(this->super_ASTNodeBasic).children_,local_28);
    pAVar2 = std::
             unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>::
             operator->(this_00);
    (*pAVar2->_vptr_ASTNodeBasic[5])(pAVar2,scope,out);
    local_28 = local_28 + 1;
  }
  vpl::Scope::Finish(scope);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                for (size_t i = 0; i < children_.size(); ++i) {
                    children_[i]->BuildProgram(scope, out);
                }
                scope->Finish();
            }